

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

Chainstate * __thiscall ChainstateManager::GetChainstateForIndexing(ChainstateManager *this)

{
  _Head_base<0UL,_Chainstate_*,_false> _Var1;
  ChainstateManager *pCVar2;
  long in_FS_OFFSET;
  _Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_30,this);
  pCVar2 = (ChainstateManager *)&this->m_active_chainstate;
  if (8 < (ulong)((long)local_30._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_30._M_impl.super__Vector_impl_data._M_start)) {
    pCVar2 = this;
  }
  _Var1._M_head_impl =
       (pCVar2->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return _Var1._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::GetChainstateForIndexing()
{
    // We can't always return `m_ibd_chainstate` because after background validation
    // has completed, `m_snapshot_chainstate == m_active_chainstate`, but it can be
    // indexed.
    return (this->GetAll().size() > 1) ? *m_ibd_chainstate : *m_active_chainstate;
}